

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O3

bool Imf_3_2::anon_unknown_0::readDeepTile<Imf_3_2::DeepTiledInputFile>
               (DeepTiledInputFile *in,bool reduceMemory,bool reduceTime)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  Array2D<float_*> *pAVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  Header *pHVar13;
  uint *puVar14;
  long lVar15;
  char *pcVar16;
  _Rb_tree_node_base *p_Var17;
  _Rb_tree_node_base *p_Var18;
  void *pvVar19;
  ulong uVar20;
  long lVar21;
  char *pcVar22;
  int iVar23;
  long size;
  size_type __new_size;
  long lVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  Array<Imf_3_2::Array2D<float_*>_> data;
  vector<float,_std::allocator<float>_> pixelBuffer;
  DeepFrameBuffer frameBuffer;
  
  Imf_3_2::DeepTiledInputFile::header();
  pHVar13 = (Header *)Imf_3_2::DeepTiledInputFile::header();
  iVar7 = Imf_3_2::calculateBytesPerPixel(pHVar13);
  Imf_3_2::DeepTiledInputFile::header();
  puVar14 = (uint *)Imf_3_2::Header::tileDescription();
  uVar2 = *puVar14;
  lVar33 = (long)(int)uVar2;
  uVar3 = puVar14[1];
  lVar15 = (long)(int)uVar3;
  iVar8 = Imf_3_2::DeepTiledInputFile::numYLevels();
  iVar9 = Imf_3_2::DeepTiledInputFile::numXLevels();
  uVar20 = lVar15 * lVar33;
  pcVar16 = (char *)operator_new__(-(ulong)(uVar20 >> 0x3e != 0) | uVar20 * 4);
  Imf_3_2::Header::channels();
  p_Var17 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  size = 0;
  while( true ) {
    Imf_3_2::Header::channels();
    p_Var18 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var17 == p_Var18) break;
    p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
    size = size + 1;
  }
  Array<Imf_3_2::Array2D<float_*>_>::Array(&data,size);
  iVar23 = (int)size;
  if (iVar23 != 0) {
    lVar32 = 0x10;
    lVar21 = size;
    do {
      pAVar6 = data._data;
      pvVar19 = operator_new__(-(ulong)(uVar20 >> 0x3d != 0) | uVar20 * 8);
      pvVar5 = *(void **)((long)&pAVar6->_sizeX + lVar32);
      if (pvVar5 != (void *)0x0) {
        operator_delete__(pvVar5);
      }
      *(long *)((long)pAVar6 + lVar32 + -0x10) = lVar15;
      *(long *)((long)pAVar6 + lVar32 + -8) = lVar33;
      *(void **)((long)&pAVar6->_sizeX + lVar32) = pvVar19;
      lVar32 = lVar32 + 0x18;
      lVar21 = lVar21 + -1;
    } while (lVar21 != 0);
  }
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  Imf_3_2::Slice::Slice((Slice *)&pixelBuffer,UINT,pcVar16,4,lVar33 * 4,1,1,0.0,true,true);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  Imf_3_2::Header::channels();
  p_Var17 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  lVar21 = 0x10;
  while( true ) {
    Imf_3_2::Header::channels();
    p_Var18 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var17 == p_Var18) break;
    Imf_3_2::DeepSlice::DeepSlice
              ((DeepSlice *)&pixelBuffer,FLOAT,*(char **)((long)&(data._data)->_sizeX + lVar21),8,
               lVar33 * 8,4,1,1,0.0,true,true);
    Imf_3_2::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)(p_Var17 + 1));
    p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
    lVar21 = lVar21 + 0x18;
  }
  Imf_3_2::DeepTiledInputFile::setFrameBuffer((DeepFrameBuffer *)in);
  pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (0 < iVar8) {
    iVar12 = 0;
    do {
      if (0 < iVar9) {
        iVar31 = 0;
        do {
          iVar1 = 0;
          while( true ) {
            iVar25 = (int)in;
            iVar10 = Imf_3_2::DeepTiledInputFile::numYTiles(iVar25);
            if (iVar10 <= iVar1) break;
            for (iVar10 = 0; iVar11 = Imf_3_2::DeepTiledInputFile::numXTiles(iVar25),
                iVar10 < iVar11; iVar10 = iVar10 + 1) {
              Imf_3_2::DeepTiledInputFile::readPixelSampleCounts
                        (iVar25,iVar10,iVar1,iVar10,iVar1,iVar31);
              if (0 < (int)uVar3) {
                lVar32 = 0;
                lVar21 = 0;
                __new_size = 0;
                pcVar22 = pcVar16;
                do {
                  if (0 < (int)uVar2) {
                    uVar20 = 0;
                    do {
                      uVar28 = (ulong)(uint)(iVar23 * *(int *)(pcVar22 + uVar20 * 4));
                      lVar21 = lVar21 + uVar28;
                      uVar26 = 0;
                      if ((uint)(*(int *)(pcVar22 + uVar20 * 4) * iVar7) < 0x1000) {
                        uVar26 = uVar28;
                      }
                      if (!reduceMemory) {
                        uVar26 = uVar28;
                      }
                      __new_size = __new_size + uVar26;
                      uVar20 = uVar20 + 1;
                    } while (uVar2 != uVar20);
                  }
                  lVar32 = lVar32 + 1;
                  pcVar22 = pcVar22 + lVar33 * 4;
                } while (lVar32 != lVar15);
                if ((__new_size != 0) &&
                   ((!reduceMemory || ((lVar21 + __new_size) * (long)iVar7 < 1000)))) {
                  std::vector<float,_std::allocator<float>_>::resize(&pixelBuffer,__new_size);
                  if (0 < (int)uVar3) {
                    lVar21 = 0;
                    lVar32 = 0;
                    do {
                      if (0 < (int)uVar2) {
                        lVar24 = 0;
                        do {
                          if ((reduceMemory) &&
                             (999 < (uint)(*(int *)(pcVar16 + lVar24 * 4 + lVar21 * lVar33 * 4) *
                                          iVar7))) {
                            if (iVar23 != 0) {
                              lVar30 = 0x10;
                              lVar27 = size;
                              do {
                                *(undefined8 *)
                                 (*(long *)((long)data._data + lVar30 + -8) * lVar21 * 8 +
                                  *(long *)((long)&(data._data)->_sizeX + lVar30) + lVar24 * 8) = 0;
                                lVar30 = lVar30 + 0x18;
                                lVar27 = lVar27 + -1;
                              } while (lVar27 != 0);
                            }
                          }
                          else if (iVar23 != 0) {
                            uVar4 = *(uint *)(pcVar16 + lVar24 * 4 + lVar21 * lVar33 * 4);
                            lVar27 = lVar32 * 4;
                            lVar32 = lVar32 + size * (ulong)uVar4;
                            lVar29 = 4;
                            lVar30 = size;
                            do {
                              *(long *)(*(long *)((long)data._data + lVar29 * 4 + -8) * lVar21 * 8 +
                                        *(long *)((long)&(data._data)->_sizeX + lVar29 * 4) +
                                       lVar24 * 8) =
                                   (long)pixelBuffer.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_start + lVar27;
                              lVar29 = lVar29 + 6;
                              lVar27 = lVar27 + (ulong)uVar4 * 4;
                              lVar30 = lVar30 + -1;
                            } while (lVar30 != 0);
                          }
                          lVar24 = lVar24 + 1;
                        } while (lVar24 != lVar33);
                      }
                      lVar21 = lVar21 + 1;
                    } while (lVar21 != lVar15);
                  }
                  Imf_3_2::DeepTiledInputFile::readTile(iVar25,iVar10,iVar1,iVar31);
                }
              }
            }
            iVar1 = iVar1 + 1;
          }
          iVar31 = iVar31 + 1;
        } while (iVar31 != iVar9);
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 != iVar8);
  }
  if (pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&frameBuffer);
  Array<Imf_3_2::Array2D<float_*>_>::~Array(&data);
  operator_delete__(pcVar16);
  return false;
}

Assistant:

bool
readDeepTile (T& in, bool reduceMemory, bool reduceTime)
{
    bool threw = false;
    try
    {
        const Header& fileHeader = in.header ();

        Array2D<unsigned int> localSampleCount;

        int      bytesPerSample = calculateBytesPerPixel (in.header ());

        const TileDescription& td         = in.header ().tileDescription ();
        int                    tileWidth  = td.xSize;
        int                    tileHeight = td.ySize;
        int                    numYLevels = in.numYLevels ();
        int                    numXLevels = in.numXLevels ();

        localSampleCount.resizeErase (tileHeight, tileWidth);

        int channelCount = 0;
        for (ChannelList::ConstIterator i = fileHeader.channels ().begin ();
             i != fileHeader.channels ().end ();
             ++i, channelCount++)
            ;

        Array<Array2D<float*>> data (channelCount);

        for (int i = 0; i < channelCount; i++)
        {
            data[i].resizeErase (tileHeight, tileWidth);
        }

        DeepFrameBuffer frameBuffer;

        //
        // Use integer arithmetic instead of pointer arithmetic to compute offset into array.
        // if memOffset is larger than base, then the computed pointer is negative, which is reported as undefined behavior
        // Instead, integers are used for computation which behaves as expected an all known architectures
        //

        frameBuffer.insertSampleCountSlice (Slice (
            UINT,
            reinterpret_cast<char*> (&localSampleCount[0][0]),
            sizeof (unsigned int) * 1,
            sizeof (unsigned int) * tileWidth,
            1,
            1,    // x/ysampling
            0.0,  // fill
            true, // relative x
            true  // relative y
            ));

        int channel = 0;
        for (ChannelList::ConstIterator i = fileHeader.channels ().begin ();
             i != fileHeader.channels ().end ();
             ++i, ++channel)
        {
            int sampleSize = sizeof (float);

            int pointerSize = sizeof (char*);

            frameBuffer.insert (
                i.name (),
                DeepSlice (
                    FLOAT,
                    reinterpret_cast<char*> (&data[channel][0][0]),
                    pointerSize * 1,
                    pointerSize * tileWidth,
                    sampleSize,
                    1,
                    1,
                    0.0,
                    true,
                    true));
        }

        in.setFrameBuffer (frameBuffer);
        size_t step = 1;

        int  tileIndex = 0;
        bool isRipMap  = td.mode == RIPMAP_LEVELS;

        vector<float> pixelBuffer;

        //
        // read all tiles from all levels.
        //
        for (int ylevel = 0; ylevel < numYLevels; ++ylevel)
        {
            for (int xlevel = 0; xlevel < numXLevels; ++xlevel)
            {
                for (int y = 0; y < in.numYTiles (ylevel); ++y)
                {
                    for (int x = 0; x < in.numXTiles (xlevel); ++x)
                    {
                        if (tileIndex % step == 0)
                        {
                            try
                            {

                                in.readPixelSampleCounts (
                                    x, y, x, y, xlevel, ylevel);

                                size_t bufferSize = 0;
                                size_t fileBufferSize = 0;

                                for (int ty = 0; ty < tileHeight; ++ty)
                                {
                                    for (int tx = 0; tx < tileWidth; ++tx)
                                    {
                                        fileBufferSize += channelCount *
                                                localSampleCount[ty][tx];

                                        if (!reduceMemory ||
                                            localSampleCount[ty][tx] *
                                                    bytesPerSample <
                                                gMaxBytesPerDeepScanline)
                                        {
                                            bufferSize +=
                                                channelCount *
                                                localSampleCount[ty][tx];
                                        }
                                    }
                                }

                                // skip reading if no data to read, or limiting memory and tile is too large
                                if (bufferSize > 0 &&
                                    (!reduceMemory ||
                                     (fileBufferSize + bufferSize) * bytesPerSample <
                                         gMaxBytesPerDeepPixel))
                                {

                                    pixelBuffer.resize (bufferSize);
                                    size_t bufferIndex = 0;

                                    for (int ty = 0; ty < tileHeight; ++ty)
                                    {
                                        for (int tx = 0; tx < tileWidth; ++tx)
                                        {
                                            if (!reduceMemory ||
                                                localSampleCount[ty][tx] *
                                                        bytesPerSample <
                                                    gMaxBytesPerDeepPixel)
                                            {
                                                for (int k = 0;
                                                     k < channelCount;
                                                     ++k)
                                                {
                                                    data[k][ty][tx] =
                                                        &pixelBuffer
                                                            [bufferIndex];
                                                    bufferIndex +=
                                                        localSampleCount[ty]
                                                                        [tx];
                                                }
                                            }
                                            else
                                            {
                                                for (int k = 0;
                                                     k < channelCount;
                                                     ++k)
                                                {
                                                    data[k][ty][tx] = nullptr;
                                                }
                                            }
                                        }
                                    }

                                    in.readTile (x, y, xlevel, ylevel);
                                }
                            }

                            catch (...)
                            {
                                //
                                // for one level and mipmapped images,
                                // xlevel must match ylevel,
                                // otherwise an exception is thrown
                                // ignore that exception
                                //
                                if (isRipMap || xlevel == ylevel)
                                {
                                    threw = true;
                                    //
                                    // in reduceTime mode, fail immediately - the file is corrupt
                                    //
                                    if (reduceTime) { return threw; }
                                }
                            }
                        }
                        tileIndex++;
                    }
                }
            }
        }
    }
    catch (...)
    {
        threw = true;
    }
    return threw;
}